

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core-as.c
# Opt level: O0

matches * mergematches(match a,matches *b)

{
  matches *pmVar1;
  match *pmVar2;
  int iVar3;
  int local_e4;
  int local_e0;
  int j_1;
  match nm;
  ull cmask;
  int j;
  int i;
  matches *res;
  matches *b_local;
  
  pmVar1 = emptymatches();
  cmask._4_4_ = 0;
  do {
    if (b->mnum <= cmask._4_4_) {
      free(b->m);
      free(b);
      return pmVar1;
    }
    cmask._0_4_ = 0;
    while (((int)cmask < 2 &&
           (nm._176_8_ = a.m[(int)cmask] & b->m[cmask._4_4_].m[(int)cmask],
           (a.a[(int)cmask] & nm._176_8_) == (b->m[cmask._4_4_].a[(int)cmask] & nm._176_8_)))) {
      cmask._0_4_ = (int)cmask + 1;
    }
    if ((int)cmask == 2) {
      memcpy(&local_e0,b->m + cmask._4_4_,0xb8);
      if (local_e0 == 0) {
        local_e0 = a.oplen;
      }
      for (cmask._0_4_ = 0; (int)cmask < 2; cmask._0_4_ = (int)cmask + 1) {
        nm.a[(long)(int)cmask + -1] = a.a[(int)cmask] | nm.a[(long)(int)cmask + -1];
        nm.a[(long)(int)cmask + 1] = a.m[(int)cmask] | nm.a[(long)(int)cmask + 1];
      }
      if (8 < a.nrelocs + (int)nm.relocs[7].expr) {
        __assert_fail("a.nrelocs + nm.nrelocs <= 8",
                      "/workspace/llm4binary/github/license_c_cmakelists/envytools[P]envytools/envydis/core-as.c"
                      ,0x4c,"struct matches *mergematches(struct match, struct matches *)");
      }
      for (local_e4 = 0; local_e4 < a.nrelocs; local_e4 = local_e4 + 1) {
        iVar3 = (int)nm.relocs[7].expr + local_e4;
        nm.relocs[(long)iVar3 + -1].expr = (easm_expr *)a.relocs[local_e4].bf;
        nm.relocs[iVar3].bf = (rbitfield *)a.relocs[local_e4].expr;
      }
      nm.relocs[7].expr._0_4_ = a.nrelocs + (int)nm.relocs[7].expr;
      if (pmVar1->mmax <= pmVar1->mnum) {
        if (pmVar1->mmax == 0) {
          pmVar1->mmax = 0x10;
        }
        else {
          pmVar1->mmax = pmVar1->mmax << 1;
        }
        pmVar2 = (match *)realloc(pmVar1->m,(long)pmVar1->mmax * 0xb8);
        pmVar1->m = pmVar2;
      }
      iVar3 = pmVar1->mnum;
      pmVar1->mnum = iVar3 + 1;
      memcpy(pmVar1->m + iVar3,&local_e0,0xb8);
    }
    cmask._4_4_ = cmask._4_4_ + 1;
  } while( true );
}

Assistant:

struct matches *mergematches(struct match a, struct matches *b) {
	struct matches *res = emptymatches();
	int i, j;
	for (i = 0; i < b->mnum; i++) {
		for (j = 0; j < MAXOPLEN; j++) {
			ull cmask = a.m[j] & b->m[i].m[j];
			if ((a.a[j] & cmask) != (b->m[i].a[j] & cmask))
				break;
		}
		if (j == MAXOPLEN) {
			struct match nm = b->m[i];
			if (!nm.oplen)
				nm.oplen = a.oplen;
			for (j = 0; j < MAXOPLEN; j++) {
				nm.a[j] |= a.a[j];
				nm.m[j] |= a.m[j];
			}
			int j;
			assert (a.nrelocs + nm.nrelocs <= 8);
			for (j = 0; j < a.nrelocs; j++)
				nm.relocs[nm.nrelocs + j] = a.relocs[j];
			nm.nrelocs += a.nrelocs;
			ADDARRAY(res->m, nm);
		}
	}
	free(b->m);
	free(b);
	return res;
}